

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O3

bool __thiscall QToolBarLayout::layoutActions(QToolBarLayout *this,QSize *size)

{
  bool bVar1;
  char cVar2;
  long *plVar3;
  QToolBarItem *pQVar4;
  byte bVar5;
  int iVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [16];
  QRect QVar9;
  bool bVar10;
  byte bVar11;
  byte bVar12;
  int spacer;
  int iVar13;
  Orientation OVar14;
  Representation RVar15;
  Representation RVar16;
  int iVar17;
  LayoutDirection direction;
  int iVar18;
  QWidget *pQVar19;
  QStyle *pQVar20;
  pointer pQVar21;
  int extraout_var;
  int *piVar22;
  long lVar23;
  undefined8 uVar24;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  QWidgetAction *this_00;
  undefined4 extraout_var_02;
  Representation RVar25;
  int iVar26;
  QRect *args;
  Representation RVar27;
  long lVar28;
  ulong uVar29;
  int iVar30;
  Representation RVar31;
  int iVar32;
  int iVar33;
  QPodArrayOps<QWidget*> *this_01;
  long lVar34;
  long lVar35;
  long in_FS_OFFSET;
  QMargins QVar36;
  QStyleOptionToolBar opt;
  int local_164;
  int local_160;
  int local_158;
  int local_140;
  int local_13c;
  int local_12c;
  QRect local_110;
  QList<QLayoutStruct> local_100;
  undefined1 local_e8 [16];
  ulong local_d8;
  undefined1 local_c8 [16];
  ulong local_b8;
  QRect local_b0;
  undefined1 local_a0 [8];
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->dirty == true) {
    updateGeomArray(this);
  }
  local_b0.x1.m_i = 0;
  local_b0.y1.m_i = 0;
  local_b0.y2.m_i = (*size).ht.m_i + -1;
  local_b0.x2.m_i = (*size).wd.m_i + -1;
  local_b8 = 0;
  local_c8 = (undefined1  [16])0x0;
  bVar10 = false;
  local_158 = 0;
  local_d8 = 0;
  local_e8 = (undefined1  [16])0x0;
  QLayout::parentWidget(&this->super_QLayout);
  pQVar19 = (QWidget *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
  if (pQVar19 != (QWidget *)0x0) {
    pQVar20 = QWidget::style(pQVar19);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)local_98);
    (**(code **)(*(long *)pQVar19 + 0x1a0))(pQVar19,(QStyleOptionToolBar *)local_98);
    bVar10 = movable(this);
    if (bVar10) {
      local_158 = (**(code **)(*(long *)pQVar20 + 0xe0))(pQVar20,0x35,local_98,pQVar19);
    }
    QVar36 = QLayout::contentsMargins(&this->super_QLayout);
    auVar8._8_8_ = QVar36._8_8_ >> 0x20;
    auVar8._0_8_ = QVar36._0_8_ >> 0x20;
    spacer = (**(code **)(*(long *)&this->super_QLayout + 0x60))(this);
    iVar13 = (**(code **)(*(long *)pQVar20 + 0xe0))(pQVar20,0x39,local_98,pQVar19);
    OVar14 = QToolBar::orientation((QToolBar *)pQVar19);
    bVar10 = OVar14 == Horizontal;
    iVar26 = local_b0.y2.m_i - local_b0.y1.m_i;
    if (bVar10) {
      iVar26 = local_b0.x2.m_i - local_b0.x1.m_i;
    }
    RVar15 = QVar36.m_top.m_i;
    RVar31 = QVar36.m_left.m_i;
    RVar16.m_i = RVar15.m_i;
    if (bVar10) {
      RVar16.m_i = RVar31.m_i;
    }
    RVar25 = QVar36.m_bottom.m_i;
    if (bVar10) {
      RVar25 = QVar36.m_right.m_i;
    }
    iVar26 = (iVar26 + 1) - (RVar16.m_i + local_158 + RVar25.m_i);
    if (iVar26 < 1) {
      bVar10 = false;
    }
    else {
      if (this->popupMenu != (QMenu *)0x0) {
        QMenu::clear(this->popupMenu);
      }
      uVar29 = (ulong)local_b0._0_8_ >> 0x20;
      if (OVar14 == Vertical) {
        uVar29 = local_b0._0_8_;
      }
      RVar16.m_i = RVar31.m_i;
      auVar7 = auVar8._0_12_;
      if (OVar14 == Vertical) {
        RVar16.m_i = RVar15.m_i;
        auVar7 = QVar36._0_12_;
      }
      local_164 = RVar16.m_i + (int)uVar29;
      if (OVar14 != Horizontal) {
        RVar15.m_i = RVar31.m_i;
      }
      local_12c = 0;
      bVar10 = false;
      bVar11 = 1;
      iVar18 = 0;
      do {
        lVar34 = (long)iVar18;
        lVar28 = (this->items).d.size;
        if (lVar28 <= lVar34) break;
        local_100.d.d = (this->geomArray).d.d;
        local_100.d.ptr = (this->geomArray).d.ptr;
        local_100.d.size = (this->geomArray).d.size;
        if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_100.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_100.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
          lVar28 = (this->items).d.size;
        }
        iVar6 = 0;
        iVar33 = iVar18;
        if (lVar34 < lVar28) {
          lVar35 = lVar34 << 5;
          iVar17 = -1;
          bVar12 = 0;
          local_160 = 0;
          local_13c = 0;
          local_140 = 0;
          iVar6 = 0;
          lVar28 = lVar34;
          do {
            pQVar21 = QList<QLayoutStruct>::data(&local_100);
            if ((&pQVar21->empty)[lVar35] == false) {
              iVar32 = spacer;
              if (local_13c == 0) {
                iVar32 = 0;
              }
              pQVar21 = QList<QLayoutStruct>::data(&local_100);
              iVar32 = iVar32 + local_140 + *(int *)((long)&pQVar21->minimumSize + lVar35);
              if ((iVar17 != -1) && (iVar26 < iVar32)) {
                if (local_12c == 0) {
                  bVar10 = true;
                }
                if ((1 < local_13c) && (iVar26 < local_140 + iVar13 + spacer)) {
                  iVar33 = iVar17;
                }
                break;
              }
              iVar30 = iVar6;
              if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
                iVar17 = (*((this->items).d.ptr[lVar28]->super_QWidgetItem).super_QLayoutItem.
                           _vptr_QLayoutItem[2])();
                iVar30 = extraout_var;
                if (OVar14 == Vertical) {
                  iVar30 = iVar17;
                }
                if (iVar30 < iVar6) {
                  iVar30 = iVar6;
                }
              }
              bVar5 = bVar12 & 1;
              bVar12 = 1;
              if (bVar5 == 0) {
                pQVar21 = QList<QLayoutStruct>::data(&local_100);
                bVar12 = (&pQVar21->expansive)[lVar35];
              }
              pQVar21 = QList<QLayoutStruct>::data(&local_100);
              bVar1 = (&pQVar21->expansive)[lVar35];
              pQVar21 = QList<QLayoutStruct>::data(&local_100);
              if (bVar1 == true) {
                piVar22 = (int *)((long)&pQVar21->maximumSize + lVar35);
              }
              else {
                piVar22 = &pQVar21[lVar28].sizeHint +
                          (ulong)(0 < *(int *)((long)&pQVar21->stretch + lVar35)) * 2;
              }
              local_160 = local_160 + spacer + *piVar22;
              local_13c = local_13c + 1;
              iVar17 = iVar33;
              local_140 = iVar32;
              iVar6 = iVar30;
            }
            lVar28 = lVar28 + 1;
            iVar33 = iVar33 + 1;
            lVar35 = lVar35 + 0x20;
          } while (lVar28 < (this->items).d.size);
        }
        else {
          local_160 = 0;
          bVar12 = 0;
        }
        lVar28 = (long)iVar33;
        pQVar21 = QList<QLayoutStruct>::data(&local_100);
        pQVar21[lVar28].sizeHint = 0;
        pQVar21 = QList<QLayoutStruct>::data(&local_100);
        pQVar21[lVar28].maximumSize = 0xffffff;
        pQVar21 = QList<QLayoutStruct>::data(&local_100);
        pQVar21[lVar28].minimumSize = 0;
        pQVar21 = QList<QLayoutStruct>::data(&local_100);
        pQVar21[lVar28].expansive = true;
        pQVar21 = QList<QLayoutStruct>::data(&local_100);
        pQVar21[lVar28].stretch = 0;
        pQVar21 = QList<QLayoutStruct>::data(&local_100);
        pQVar21[lVar28].empty = true;
        if (((bVar12 & 1) != 0) && (iVar26 - local_160 != 0 && local_160 <= iVar26)) {
          pQVar21 = QList<QLayoutStruct>::data(&local_100);
          pQVar21[lVar28].maximumSize = iVar26 - local_160;
          bVar12 = 0;
        }
        iVar17 = 0;
        if (bVar10) {
          iVar17 = iVar13 + spacer;
        }
        qGeomCalc(&local_100,iVar18,(iVar33 - iVar18) + (uint)(~bVar12 & 1),0,iVar26 - iVar17,spacer
                 );
        if (iVar18 < iVar33) {
          iVar18 = 0;
          if (OVar14 == Vertical) {
            iVar18 = local_164;
          }
          lVar35 = lVar28 - lVar34;
          lVar34 = lVar34 << 3;
          do {
            plVar3 = *(long **)((long)(this->items).d.ptr + lVar34);
            pQVar21 = QList<QLayoutStruct>::data(&local_100);
            if ((&pQVar21->empty)[lVar34 * 4] == true) {
              lVar23 = (**(code **)(*plVar3 + 0x68))(plVar3);
              if ((*(byte *)(*(long *)(lVar23 + 0x20) + 10) & 1) == 0) {
                uVar24 = (**(code **)(*plVar3 + 0x68))(plVar3);
                local_110.x1.m_i = (int)uVar24;
                local_110.y1.m_i = (int)((ulong)uVar24 >> 0x20);
                this_01 = (QPodArrayOps<QWidget*> *)local_e8;
                args = &local_110;
                uVar29 = local_d8;
LAB_004b682d:
                QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                          (this_01,uVar29,(QWidget **)args);
                QList<QWidget_*>::end((QList<QWidget_*> *)this_01);
              }
            }
            else {
              pQVar21 = QList<QLayoutStruct>::data(&local_100);
              RVar27.m_i = (&pQVar21->pos)[lVar34] + RVar15.m_i + local_158;
              if (OVar14 == Horizontal) {
                pQVar21 = QList<QLayoutStruct>::data(&local_100);
                iVar17 = (&pQVar21->size)[lVar34];
                iVar32 = -1;
                local_110.x1.m_i = RVar27.m_i;
                RVar27.m_i = local_164;
              }
              else {
                if (OVar14 != Vertical) {
                  RVar27.m_i = local_164;
                }
                pQVar21 = QList<QLayoutStruct>::data(&local_100);
                iVar32 = (&pQVar21->size)[lVar34];
                iVar17 = -1;
                local_110.x1.m_i = iVar18;
              }
              iVar30 = iVar6;
              if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\0') {
                iVar30 = local_b0.y2.m_i - local_b0.y1.m_i;
                if (OVar14 == Vertical) {
                  iVar30 = local_b0.x2.m_i - local_b0.x1.m_i;
                }
                iVar30 = (iVar30 - (auVar7._8_4_ + auVar7._0_4_)) + 1;
              }
              if (OVar14 != Vertical) {
                iVar32 = iVar30;
                iVar30 = iVar17;
              }
              local_110.y1.m_i = RVar27.m_i;
              local_110.x2.m_i = local_110.x1.m_i + -1 + iVar30;
              local_110.y2.m_i = iVar32 + RVar27.m_i + -1;
              if (OVar14 == Horizontal) {
                pQVar19 = QLayout::parentWidget(&this->super_QLayout);
                direction = QWidget::layoutDirection(pQVar19);
                local_110 = QStyle::visualRect(direction,&local_b0,&local_110);
              }
              (**(code **)(*plVar3 + 0x30))(plVar3,&local_110);
              lVar23 = (**(code **)(*plVar3 + 0x68))(plVar3);
              if ((*(byte *)(*(long *)(lVar23 + 0x20) + 10) & 1) != 0) {
                local_a0 = (undefined1  [8])(**(code **)(*plVar3 + 0x68))(plVar3);
                this_01 = (QPodArrayOps<QWidget*> *)local_c8;
                args = (QRect *)local_a0;
                uVar29 = local_b8;
                goto LAB_004b682d;
              }
            }
            lVar34 = lVar34 + 8;
            lVar35 = lVar35 + -1;
          } while (lVar35 != 0);
        }
        cVar2 = (this->super_QLayout).super_QLayoutItem.field_0xc;
        if (cVar2 == '\0') {
          for (; lVar28 < (this->items).d.size; lVar28 = lVar28 + 1) {
            pQVar4 = (this->items).d.ptr[lVar28];
            iVar18 = (*(pQVar4->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])(pQVar4)
            ;
            if ((*(byte *)(*(long *)(CONCAT44(extraout_var_00,iVar18) + 0x20) + 10) & 1) == 0) {
              iVar18 = (*(pQVar4->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])
                                 (pQVar4);
              QVar9 = local_110;
              local_110.y1.m_i = extraout_var_01;
              local_110.x1.m_i = iVar18;
              local_110._8_8_ = QVar9._8_8_;
              QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                        ((QPodArrayOps<QWidget*> *)local_e8,local_d8,(QWidget **)&local_110);
              QList<QWidget_*>::end((QList<QWidget_*> *)local_e8);
            }
            if (this->popupMenu != (QMenu *)0x0) {
              this_00 = (QWidgetAction *)
                        QMetaObject::cast((QObject *)&QWidgetAction::staticMetaObject);
              if (this_00 != (QWidgetAction *)0x0) {
                pQVar19 = QWidgetAction::defaultWidget(this_00);
                iVar18 = (*(pQVar4->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])
                                   (pQVar4);
                if (pQVar19 == (QWidget *)CONCAT44(extraout_var_02,iVar18)) goto LAB_004b6946;
              }
              QWidget::addAction(&this->popupMenu->super_QWidget,pQVar4->action);
              bVar11 = 0;
            }
LAB_004b6946:
          }
        }
        else {
          local_164 = local_164 + spacer + iVar6;
          local_12c = local_12c + 1;
        }
        if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,0x20,0x10);
          }
        }
        iVar18 = iVar33;
      } while (cVar2 != '\0');
      QWidget::setEnabled((QWidget *)this->extension,
                          (bool)(~bVar11 & 1 | this->popupMenu == (QMenu *)0x0));
      if (local_b8 != 0) {
        uVar29 = 0;
        do {
          QWidget::show(*(QWidget **)(local_c8._8_8_ + uVar29 * 8));
          uVar29 = uVar29 + 1;
        } while (uVar29 < local_b8);
      }
      if (local_d8 != 0) {
        uVar29 = 0;
        do {
          QWidget::hide(*(QWidget **)(local_e8._8_8_ + uVar29 * 8));
          uVar29 = uVar29 + 1;
        } while (uVar29 < local_d8);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_98);
    if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_e8._0_8_,8,0x10);
      }
    }
  }
  if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_c8._0_8_,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar10;
}

Assistant:

bool QToolBarLayout::layoutActions(const QSize &size)
{
    if (dirty)
        updateGeomArray();

    QRect rect(0, 0, size.width(), size.height());

    QList<QWidget*> showWidgets, hideWidgets;

    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return false;
    QStyle *style = tb->style();
    QStyleOptionToolBar opt;
    tb->initStyleOption(&opt);
    const int handleExtent = movable()
            ? style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb) : 0;
    const QMargins margins = contentsMargins();
    const int spacing = this->spacing();
    const int extensionExtent = style->pixelMetric(QStyle::PM_ToolBarExtensionExtent, &opt, tb);
    Qt::Orientation o = tb->orientation();
    bool extensionMenuContainsOnlyWidgetActions = true;

    int space = pick(o, rect.size()) - pick(o, margins) - handleExtent;
    if (space <= 0)
        return false;  // nothing to do.

    if (popupMenu)
        popupMenu->clear();

    bool ranOutOfSpace = false;
    int rows = 0;
    int rowPos = perp(o, rect.topLeft()) + perp(o, QSize(margins.top(), margins.left()));
    int i = 0;
    while (i < items.size()) {
        QList<QLayoutStruct> a = geomArray;

        int start = i;
        int size = 0;
        int prev = -1;
        int rowHeight = 0;
        int count = 0;
        int maximumSize = 0;
        bool expansiveRow = false;
        for (; i < items.size(); ++i) {
            if (a[i].empty)
                continue;

            int newSize = size + (count == 0 ? 0 : spacing) + a[i].minimumSize;
            if (prev != -1 && newSize > space) {
                if (rows == 0)
                    ranOutOfSpace = true;
                // do we have to move the previous item to the next line to make space for
                // the extension button?
                if (count > 1 && size + spacing + extensionExtent > space)
                    i = prev;
                break;
            }

            if (expanded)
                rowHeight = qMax(rowHeight, perp(o, items.at(i)->sizeHint()));
            expansiveRow = expansiveRow || a[i].expansive;
            size = newSize;
            maximumSize += spacing + (a[i].expansive ? a[i].maximumSize : a[i].smartSizeHint());
            prev = i;
            ++count;
        }

        // stretch at the end
        a[i].sizeHint = 0;
        a[i].maximumSize = QWIDGETSIZE_MAX;
        a[i].minimumSize = 0;
        a[i].expansive = true;
        a[i].stretch = 0;
        a[i].empty = true;

        if (expansiveRow && maximumSize < space) {
            expansiveRow = false;
            a[i].maximumSize = space - maximumSize;
        }

        qGeomCalc(a, start, i - start + (expansiveRow ? 0 : 1), 0,
                    space - (ranOutOfSpace ? (extensionExtent + spacing) : 0),
                    spacing);

        for (int j = start; j < i; ++j) {
            QToolBarItem *item = items.at(j);

            if (a[j].empty) {
                if (!item->widget()->isHidden())
                    hideWidgets << item->widget();
                continue;
            }

            QPoint pos;
            rpick(o, pos) = pick(o, QSize(margins.top(), margins.left())) + handleExtent + a[j].pos;
            rperp(o, pos) = rowPos;
            QSize size;
            rpick(o, size) = a[j].size;
            if (expanded)
                rperp(o, size) = rowHeight;
            else
                rperp(o, size) = perp(o, rect.size()) - perp(o, margins);
            QRect r(pos, size);

            if (o == Qt::Horizontal)
                r = QStyle::visualRect(parentWidget()->layoutDirection(), rect, r);

            item->setGeometry(r);

            if (item->widget()->isHidden())
                showWidgets << item->widget();
        }

        if (!expanded) {
            for (int j = i; j < items.size(); ++j) {
                QToolBarItem *item = items.at(j);
                if (!item->widget()->isHidden())
                    hideWidgets << item->widget();
                if (popupMenu) {
                    if (!defaultWidgetAction(item)) {
                        popupMenu->addAction(item->action);
                        extensionMenuContainsOnlyWidgetActions = false;
                    }
                }
            }
            break;
        }

        rowPos += rowHeight + spacing;
        ++rows;
    }

    // if we are using a popup menu, not the expadning toolbar effect, we cannot move custom
    // widgets into the menu. If only custom widget actions are chopped off, the popup menu
    // is empty. So we show the little extension button to show something is chopped off,
    // but we make it disabled.
    extension->setEnabled(popupMenu == nullptr || !extensionMenuContainsOnlyWidgetActions);

    // we have to do the show/hide here, because it triggers more calls to setGeometry :(
    for (int i = 0; i < showWidgets.size(); ++i)
        showWidgets.at(i)->show();
    for (int i = 0; i < hideWidgets.size(); ++i)
        hideWidgets.at(i)->hide();

    return ranOutOfSpace;
}